

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::ImageButtonEx
               (ImGuiID id,ImTextureID texture_id,ImVec2 *size,ImVec2 *uv0,ImVec2 *uv1,
               ImVec2 *padding,ImVec4 *bg_col,ImVec4 *tint_col)

{
  ImVec2 IVar1;
  ImGuiWindow *pIVar2;
  ImDrawList *pIVar3;
  float fVar4;
  float fVar5;
  ImGuiContext *pIVar6;
  ImRect IVar7;
  bool bVar8;
  bool bVar9;
  ImU32 IVar10;
  int iVar11;
  int idx;
  ImGuiContext *g;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  bool held;
  bool hovered;
  ImU32 local_6c;
  ImRect bb;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar6 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->SkipItems == false) {
    IVar1 = (pIVar2->DC).CursorPos;
    auVar12._8_8_ = 0;
    auVar12._0_4_ = IVar1.x;
    auVar12._4_4_ = IVar1.y;
    fVar4 = (*padding).x;
    fVar5 = (*padding).y;
    auVar15._0_4_ = IVar1.x + (*size).x + fVar4 + fVar4;
    auVar15._4_4_ = IVar1.y + (*size).y + fVar5 + fVar5;
    auVar15._8_8_ = 0;
    bb = (ImRect)vmovlhps_avx(auVar12,auVar15);
    ItemSize(&bb,-1.0);
    bVar9 = false;
    bVar8 = ItemAdd(&bb,id,(ImRect *)0x0);
    if (bVar8) {
      bVar9 = ButtonBehavior(&bb,id,&hovered,&held,0);
      iVar11 = ((held ^ 1U) & hovered) + 0x15;
      idx = 0x17;
      if ((hovered & 1U) == 0) {
        idx = iVar11;
      }
      if (held == false) {
        idx = iVar11;
      }
      local_6c = GetColorU32(idx,1.0);
      RenderNavHighlight(&bb,id,1);
      auVar12 = vminss_avx(ZEXT416((uint)padding->x),ZEXT416((uint)padding->y));
      auVar15 = vminss_avx(ZEXT416((uint)(pIVar6->Style).FrameRounding),auVar12);
      auVar12 = vcmpss_avx(auVar12,ZEXT816(0) << 0x40,1);
      auVar12 = vandnps_avx(auVar12,auVar15);
      RenderFrame(bb.Min,bb.Max,local_6c,true,auVar12._0_4_);
      IVar7 = bb;
      if (0.0 < bg_col->w) {
        pIVar3 = pIVar2->DrawList;
        IVar1 = *padding;
        auVar13._8_8_ = 0;
        auVar13._0_4_ = IVar1.x;
        auVar13._4_4_ = IVar1.y;
        auVar18._8_8_ = 0;
        auVar18._0_4_ = bb.Max.x;
        auVar18._4_4_ = bb.Max.y;
        auVar16._0_4_ = IVar7.Min.x + IVar1.x;
        auVar16._4_4_ = IVar7.Min.y + IVar1.y;
        auVar16._8_8_ = 0;
        local_38 = (ImVec2)vmovlps_avx(auVar16);
        auVar12 = vsubps_avx(auVar18,auVar13);
        local_40 = (ImVec2)vmovlps_avx(auVar12);
        bb = IVar7;
        IVar10 = GetColorU32(bg_col);
        ImDrawList::AddRectFilled(pIVar3,&local_38,&local_40,IVar10,0.0,0xf);
      }
      IVar7 = bb;
      pIVar3 = pIVar2->DrawList;
      IVar1 = *padding;
      auVar14._8_8_ = 0;
      auVar14._0_4_ = IVar1.x;
      auVar14._4_4_ = IVar1.y;
      auVar19._8_8_ = 0;
      auVar19._0_4_ = bb.Max.x;
      auVar19._4_4_ = bb.Max.y;
      auVar17._0_4_ = IVar7.Min.x + IVar1.x;
      auVar17._4_4_ = IVar7.Min.y + IVar1.y;
      auVar17._8_8_ = 0;
      local_38 = (ImVec2)vmovlps_avx(auVar17);
      auVar12 = vsubps_avx(auVar19,auVar14);
      local_40 = (ImVec2)vmovlps_avx(auVar12);
      bb = IVar7;
      IVar10 = GetColorU32(tint_col);
      ImDrawList::AddImage(pIVar3,texture_id,&local_38,&local_40,uv0,uv1,IVar10);
    }
  }
  else {
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool ImGui::ImageButtonEx(ImGuiID id, ImTextureID texture_id, const ImVec2& size, const ImVec2& uv0, const ImVec2& uv1, const ImVec2& padding, const ImVec4& bg_col, const ImVec4& tint_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size + padding * 2);
    ItemSize(bb);
    if (!ItemAdd(bb, id))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);

    // Render
    const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, col, true, ImClamp((float)ImMin(padding.x, padding.y), 0.0f, g.Style.FrameRounding));
    if (bg_col.w > 0.0f)
        window->DrawList->AddRectFilled(bb.Min + padding, bb.Max - padding, GetColorU32(bg_col));
    window->DrawList->AddImage(texture_id, bb.Min + padding, bb.Max - padding, uv0, uv1, GetColorU32(tint_col));

    return pressed;
}